

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void __thiscall
Js::DynamicProfileInfo::RecordParameterAtCallSite
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId,Var arg,
          int argNum,RegSlot regSlot)

{
  ushort uVar1;
  code *pcVar2;
  uint uVar3;
  FunctionBody *pFVar4;
  bool bVar5;
  ProfileId PVar6;
  RegSlot RVar7;
  FunctionBody **ppFVar8;
  undefined4 *puVar9;
  CallSiteInfo **ppCVar10;
  FunctionInfo *pFVar11;
  JavascriptFunction *this_00;
  CallbackInfo *pCVar12;
  byte bVar13;
  CallbackInfo *callbackInfo_1;
  JavascriptFunction *callback_1;
  LocalFunctionId functionId;
  SourceId sourceId;
  JavascriptFunction *callback;
  CallbackInfo *callbackInfo;
  RegSlot regSlot_local;
  int argNum_local;
  Var arg_local;
  FunctionBody *pFStack_18;
  ProfileId callSiteId_local;
  FunctionBody *functionBody_local;
  DynamicProfileInfo *this_local;
  
  callbackInfo._0_4_ = regSlot;
  callbackInfo._4_4_ = argNum;
  _regSlot_local = arg;
  arg_local._6_2_ = callSiteId;
  pFStack_18 = functionBody;
  functionBody_local = (FunctionBody *)this;
  bVar5 = NeedProfileInfoList();
  if (((bVar5) && ((this->persistsAcrossScriptContexts & 1U) == 0)) &&
     (ppFVar8 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                          ((WriteBarrierPtr *)&this->functionBody), *ppFVar8 != pFStack_18)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x1ac,
                                "(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody)"
                                ,
                                "!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody"
                               );
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (0xe < callbackInfo._4_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x1af,"(argNum < Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                                "argNum < Js::InlineeCallInfo::MaxInlineeArgoutCount");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  uVar1 = arg_local._6_2_;
  PVar6 = FunctionBody::GetProfiledCallSiteCount(pFStack_18);
  if (PVar6 <= uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x1b0,"(callSiteId < functionBody->GetProfiledCallSiteCount())",
                                "callSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar5 = PhaseIsEnabled::InlineCallbacksPhase<Js::FunctionBody*>(pFStack_18);
  if (bVar5) {
    if (((_regSlot_local == (Var)0x0) ||
        (bVar5 = VarIs<Js::RecyclableObject>(_regSlot_local), !bVar5)) ||
       (bVar5 = VarIs<Js::JavascriptFunction>(_regSlot_local), !bVar5)) {
      pCVar12 = FindCallbackInfo(this,pFStack_18,arg_local._6_2_);
      if ((pCVar12 != (CallbackInfo *)0x0) && ((*(byte *)pCVar12 >> 2 & 0x1f) == callbackInfo._4_4_)
         ) {
        *(byte *)pCVar12 = *(byte *)pCVar12 & 0xfe;
      }
      bVar5 = TaggedInt::Is(_regSlot_local);
      uVar3 = (RegSlot)callbackInfo;
      if ((bVar5) && (RVar7 = FunctionBody::GetConstantCount(pFStack_18), uVar3 < RVar7)) {
        ppCVar10 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                             ((WriteBarrierPtr *)&this->callSiteInfo);
        uVar1 = *(ushort *)&(*ppCVar10)[arg_local._6_2_].field_0x2;
        bVar13 = (byte)callbackInfo._4_4_;
        ppCVar10 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                             ((WriteBarrierPtr *)&this->callSiteInfo);
        *(ushort *)&(*ppCVar10)[arg_local._6_2_].field_0x2 =
             *(ushort *)&(*ppCVar10)[arg_local._6_2_].field_0x2 & 0xe000 |
             uVar1 & 0x1fff | (ushort)(1 << (bVar13 & 0x1f)) & 0x1fff;
      }
    }
    else {
      callback = (JavascriptFunction *)EnsureCallbackInfo(this,pFStack_18,arg_local._6_2_);
      if (*(Type *)((long)&(callback->super_DynamicObject).super_RecyclableObject.
                           super_FinalizableObject.super_IRecyclerVisitedObject.
                           _vptr_IRecyclerVisitedObject + 4) == 0xffffffff) {
        _functionId = UnsafeVarTo<Js::JavascriptFunction>(_regSlot_local);
        pFVar4 = pFStack_18;
        pFVar11 = JavascriptFunction::GetFunctionInfo(_functionId);
        GetSourceAndFunctionId
                  (pFVar4,pFVar11,_functionId,
                   (SourceId *)
                   ((long)&(callback->super_DynamicObject).super_RecyclableObject.
                           super_FinalizableObject.super_IRecyclerVisitedObject.
                           _vptr_IRecyclerVisitedObject + 4),
                   (LocalFunctionId *)&(callback->super_DynamicObject).super_RecyclableObject.type);
        *(byte *)&(callback->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
             *(byte *)&(callback->super_DynamicObject).super_RecyclableObject.
                       super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject & 0x83 | ((byte)callbackInfo._4_4_ & 0x1f) << 2;
      }
      else if (((ulong)(callback->super_DynamicObject).super_RecyclableObject.
                       super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject & 1) != 0) {
        if (callbackInfo._4_4_ ==
            (*(byte *)&(callback->super_DynamicObject).super_RecyclableObject.
                       super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject >> 2 & 0x1f)) {
          if ((*(byte *)&(callback->super_DynamicObject).super_RecyclableObject.
                         super_FinalizableObject.super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject >> 1 & 1) == 0) {
            this_00 = UnsafeVarTo<Js::JavascriptFunction>(_regSlot_local);
            pFVar4 = pFStack_18;
            pFVar11 = JavascriptFunction::GetFunctionInfo(this_00);
            GetSourceAndFunctionId
                      (pFVar4,pFVar11,this_00,(SourceId *)((long)&callback_1 + 4),
                       (LocalFunctionId *)&callback_1);
            if ((callback_1._4_4_ !=
                 *(int *)((long)&(callback->super_DynamicObject).super_RecyclableObject.
                                 super_FinalizableObject.super_IRecyclerVisitedObject.
                                 _vptr_IRecyclerVisitedObject + 4)) ||
               ((int)callback_1 !=
                *(int *)&(callback->super_DynamicObject).super_RecyclableObject.type.ptr)) {
              *(byte *)&(callback->super_DynamicObject).super_RecyclableObject.
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject =
                   *(byte *)&(callback->super_DynamicObject).super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject & 0xfd | 2;
            }
          }
        }
        else {
          *(byte *)&(callback->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
               *(byte *)&(callback->super_DynamicObject).super_RecyclableObject.
                         super_FinalizableObject.super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject & 0xfe;
        }
      }
    }
  }
  else {
    bVar5 = TaggedInt::Is(_regSlot_local);
    uVar3 = (RegSlot)callbackInfo;
    if ((bVar5) && (RVar7 = FunctionBody::GetConstantCount(pFStack_18), uVar3 < RVar7)) {
      ppCVar10 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                           ((WriteBarrierPtr *)&this->callSiteInfo);
      uVar1 = *(ushort *)&(*ppCVar10)[arg_local._6_2_].field_0x2;
      bVar13 = (byte)callbackInfo._4_4_;
      ppCVar10 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                           ((WriteBarrierPtr *)&this->callSiteInfo);
      *(ushort *)&(*ppCVar10)[arg_local._6_2_].field_0x2 =
           *(ushort *)&(*ppCVar10)[arg_local._6_2_].field_0x2 & 0xe000 |
           uVar1 & 0x1fff | (ushort)(1 << (bVar13 & 0x1f)) & 0x1fff;
    }
  }
  return;
}

Assistant:

void DynamicProfileInfo::RecordParameterAtCallSite(FunctionBody * functionBody, ProfileId callSiteId, Var arg, int argNum, Js::RegSlot regSlot)
    {
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
        // If we persistsAcrossScriptContext, the dynamic profile info may be referred to by multiple function body from
        // different script context
        Assert(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody);
#endif

        Assert(argNum < Js::InlineeCallInfo::MaxInlineeArgoutCount);
        Assert(callSiteId < functionBody->GetProfiledCallSiteCount());

        if (!PHASE_ENABLED(InlineCallbacksPhase, functionBody))
        {
            if (TaggedInt::Is(arg) && regSlot < functionBody->GetConstantCount())
            {
                callSiteInfo[callSiteId].isArgConstant = callSiteInfo[callSiteId].isArgConstant | (1 << argNum);
            }
            return;
        }

        if (arg != nullptr && VarIs<RecyclableObject>(arg) && VarIs<JavascriptFunction>(arg))
        {
            CallbackInfo * callbackInfo = EnsureCallbackInfo(functionBody, callSiteId);
            if (callbackInfo->sourceId == NoSourceId)
            {
                JavascriptFunction * callback = UnsafeVarTo<JavascriptFunction>(arg);
                GetSourceAndFunctionId(functionBody, callback->GetFunctionInfo(), callback, &callbackInfo->sourceId, &callbackInfo->functionId);
                callbackInfo->argNumber = argNum;
            }
            else if (callbackInfo->canInlineCallback)
            {
                if (argNum != callbackInfo->argNumber)
                {
                    callbackInfo->canInlineCallback = false;
                }
                else if (!callbackInfo->isPolymorphic)
                {
                    Js::SourceId sourceId;
                    Js::LocalFunctionId functionId;
                    JavascriptFunction * callback = UnsafeVarTo<JavascriptFunction>(arg);
                    GetSourceAndFunctionId(functionBody, callback->GetFunctionInfo(), callback, &sourceId, &functionId);

                    if (sourceId != callbackInfo->sourceId || functionId != callbackInfo->functionId)
                    {
                        callbackInfo->isPolymorphic = true;
                    }
                }
            }
        }
        else
        {
            CallbackInfo * callbackInfo = FindCallbackInfo(functionBody, callSiteId);
            if (callbackInfo != nullptr && callbackInfo->argNumber == argNum)
            {
                callbackInfo->canInlineCallback = false;
            }

            if (TaggedInt::Is(arg) && regSlot < functionBody->GetConstantCount())
            {
                callSiteInfo[callSiteId].isArgConstant = callSiteInfo[callSiteId].isArgConstant | (1 << argNum);
            }
        }
    }